

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L.c
# Opt level: O1

int parse_at(envy_bios *bios,envy_bios_p *p,int idx,int offset,char **name)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  envy_bios_p_falcon_ucode **ppeVar5;
  uint16_t uVar6;
  char **ppcVar7;
  uint uVar8;
  envy_bios_p_falcon_ucode **ppeVar9;
  envy_bios_p_falcon_ucode *local_50;
  undefined1 local_48 [8];
  char *local_40;
  char *local_38 [2];
  envy_bios_p_falcon_ucode *local_28;
  
  local_48[0] = 0;
  local_28 = &p->falcon_ucode;
  local_38[0] = "FALCON UCODE";
  uVar1 = p->bit->version;
  iVar3 = -0x16;
  if (uVar1 == '\x01') {
    uVar8 = 0;
    ppcVar7 = &local_40;
    ppeVar5 = (envy_bios_p_falcon_ucode **)local_48;
    ppeVar9 = &local_50;
  }
  else {
    if (uVar1 != '\x02') {
      return -0x16;
    }
    uVar8 = 1;
    ppeVar9 = (envy_bios_p_falcon_ucode **)local_48;
    ppeVar5 = &local_28;
    ppcVar7 = local_38;
  }
  if (idx == -1 || offset == -1) {
    if (-1 < offset) {
      idx = 0;
      do {
        if (uVar8 <= (uint)idx) goto LAB_002683ed;
        idx = 1;
      } while ((uint)*(byte *)ppeVar9 != offset);
      idx = 0;
    }
LAB_002683ed:
    iVar3 = -2;
    if (((uint)idx < uVar8) && (bVar2 = *(byte *)ppeVar9, (ushort)(bVar2 + 2) <= p->bit->t_len)) {
      if (name != (char **)0x0) {
        *name = *ppcVar7;
      }
      lVar4 = (ulong)p->bit->t_offset + (ulong)bVar2;
      if ((int)lVar4 + 3U < bios->length) {
        uVar6 = *(uint16_t *)(bios->data + lVar4);
        iVar3 = 0;
      }
      else {
        uVar6 = 0;
        fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
        iVar3 = -0xe;
      }
      (*ppeVar5)->offset = uVar6;
    }
  }
  return iVar3;
}

Assistant:

static int
parse_at(struct envy_bios *bios, unsigned int idx, const char **name)
{
	struct envy_bios_L *l = &bios->L;
	struct L_known_tables tbls[] = {
		{ 0x0, &l->unk0.offset, "UNK0 TABLE" },
	};
	int entries_count = (sizeof(tbls) / sizeof(struct L_known_tables));

	/* check the index */
	if (idx >= entries_count)
		return -ENOENT;

	/* check the table has the right size */
	if (tbls[idx].offset + 2 > l->bit->t_len)
		return -ENOENT;

	if (name)
		*name = tbls[idx].name;

	return bios_u16(bios, l->bit->t_offset + tbls[idx].offset, tbls[idx].ptr);
}